

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_ExtensionJsonNameError_Test::
~ParserValidationErrorTest_ExtensionJsonNameError_Test
          (ParserValidationErrorTest_ExtensionJsonNameError_Test *this)

{
  ParserValidationErrorTest_ExtensionJsonNameError_Test *this_local;
  
  ~ParserValidationErrorTest_ExtensionJsonNameError_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, ExtensionJsonNameError) {
  ExpectHasValidationErrors(
      "message TestMessage {\n"
      "  extensions 1 to 100;\n"
      "}\n"
      "extend TestMessage {\n"
      "  optional int32 foo = 12 [json_name = \"bar\"];\n"
      "}",
      "4:27: option json_name is not allowed on extension fields.\n");
}